

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> * __thiscall
Js::PathTypeHandlerBase::
ConvertToSimpleDictionaryType<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>>
          (PathTypeHandlerBase *this,DynamicObject *instance,int propertyCapacity,
          bool mayBecomeShared)

{
  code *pcVar1;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *oldType_00;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  PropertyAttributes PVar5;
  BYTE values;
  PropertyTypes values_00;
  uint16 uVar6;
  uint16 offsetOfInlineSlots;
  int slotCapacity;
  TypeId TVar7;
  int iVar8;
  undefined4 *puVar9;
  DynamicTypeHandler *pDVar10;
  PathTypeHandlerBase *pPVar11;
  Recycler *alloc;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *pSVar12;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  RecyclerWeakReference<Js::DynamicObject> *pRVar13;
  DynamicObject *pDVar14;
  DynamicType *pDVar15;
  undefined4 extraout_var;
  TypePath *pTVar17;
  PropertyRecord *pPVar18;
  DynamicType *newType;
  bool local_129;
  bool local_115;
  byte local_fc;
  byte local_fb;
  byte local_fa;
  bool local_f9;
  TypePath *typePath;
  PropertyIndex i;
  ObjectSlotAttributes *attributes;
  bool transferUsedAsFixed;
  bool transferIsFixed;
  RecyclerWeakReference<Js::DynamicObject> *curSingletonInstance;
  bool canBeSingletonInstance;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstance;
  TrackAllocData local_70;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *local_48;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *newTypeHandler;
  DynamicType *oldType;
  PathTypeHandlerBase *oldTypeHandler;
  Recycler *recycler;
  ScriptContext *scriptContext;
  bool mayBecomeShared_local;
  DynamicObject *pDStack_18;
  int propertyCapacity_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  long lVar16;
  
  scriptContext._3_1_ = mayBecomeShared;
  scriptContext._4_4_ = propertyCapacity;
  pDStack_18 = instance;
  instance_local = (DynamicObject *)this;
  bVar2 = CanConvertToSimpleDictionaryType(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x64e,"(CanConvertToSimpleDictionaryType())",
                                "CanConvertToSimpleDictionaryType()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (pDStack_18 == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x64f,"(instance)","instance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  recycler = (Recycler *)RecyclableObject::GetScriptContext(&pDStack_18->super_RecyclableObject);
  oldTypeHandler = (PathTypeHandlerBase *)ScriptContext::GetRecycler((ScriptContext *)recycler);
  (*(pDStack_18->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x68])();
  oldType = (DynamicType *)0x0;
  bVar2 = DynamicObject::DeoptimizeObjectHeaderInlining(pDStack_18);
  pPVar11 = this;
  if (bVar2) {
    pDVar10 = DynamicObject::GetTypeHandler(pDStack_18);
    iVar8 = (*pDVar10->_vptr_DynamicTypeHandler[0x4e])();
    if (iVar8 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x660,"(instance->GetTypeHandler()->IsPathTypeHandler())",
                                  "instance->GetTypeHandler()->IsPathTypeHandler()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pPVar11 = (PathTypeHandlerBase *)DynamicObject::GetTypeHandler(pDStack_18);
  }
  oldType = (DynamicType *)pPVar11;
  if (oldType == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x668,"(oldTypeHandler)","oldTypeHandler");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  newTypeHandler =
       (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *)
       DynamicObject::GetDynamicType(pDStack_18);
  pPVar11 = oldTypeHandler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,
             (type_info *)
             &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
              typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
             ,0x66d);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)pPVar11,&local_70);
  pSVar12 = (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *)
            new<Memory::Recycler>(0x30,alloc,0x43c4b0);
  pPVar11 = oldTypeHandler;
  slotCapacity = DynamicTypeHandler::GetSlotCapacity((DynamicTypeHandler *)oldType);
  iVar8 = scriptContext._4_4_;
  uVar6 = DynamicTypeHandler::GetInlineSlotCapacity((DynamicTypeHandler *)oldType);
  offsetOfInlineSlots = DynamicTypeHandler::GetOffsetOfInlineSlots((DynamicTypeHandler *)oldType);
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
  SimpleDictionaryTypeHandlerBase
            (pSVar12,(Recycler *)pPVar11,slotCapacity,iVar8,uVar6,offsetOfInlineSlots,false,false);
  local_48 = pSVar12;
  bVar2 = DynamicTypeHandler::GetHasOnlyWritableDataProperties((DynamicTypeHandler *)pSVar12);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x66f,"(newTypeHandler->GetHasOnlyWritableDataProperties())",
                                "newTypeHandler->GetHasOnlyWritableDataProperties()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  oldSingletonInstanceBefore = GetSingletonInstance((PathTypeHandlerBase *)oldType);
  TraceFixedFieldsBeforeTypeHandlerChange
            (L"converting",L"PathTypeHandler",L"SimpleDictionaryTypeHandler",pDStack_18,
             (DynamicTypeHandler *)oldType,(DynamicType *)newTypeHandler,oldSingletonInstanceBefore)
  ;
  bVar2 = DynamicTypeHandler::CanBeSingletonInstance(pDStack_18);
  if ((!bVar2) && (bVar3 = HasSingletonInstance((PathTypeHandlerBase *)oldType), bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x6ba,
                                "(canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance())"
                                ,"canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance()"
                               );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (((scriptContext._3_1_ & 1) == 0) && (bVar2)) {
    bVar3 = HasSingletonInstanceOnlyIfNeeded((PathTypeHandlerBase *)oldType);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x6c0,"(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                  "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    bVar3 = DynamicTypeHandler::AreSingletonInstancesNeeded();
    if (bVar3) {
      pTVar17 = GetTypePath((PathTypeHandlerBase *)oldType);
      pRVar13 = TypePath::GetSingletonInstance(pTVar17);
      if ((pRVar13 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) ||
         (pDVar14 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(pRVar13),
         pDVar14 != pDStack_18)) {
        pSVar12 = local_48;
        pRVar13 = DynamicObject::CreateWeakReferenceToSelf(pDStack_18);
        DynamicTypeHandler::SetSingletonInstance(&pSVar12->super_DynamicTypeHandler,pRVar13);
      }
      else {
        DynamicTypeHandler::SetSingletonInstance(&local_48->super_DynamicTypeHandler,pRVar13);
      }
    }
  }
  local_f9 = false;
  if ((scriptContext._3_1_ & 1) == 0) {
    local_f9 = bVar2;
  }
  bVar2 = DynamicTypeHandler::IsolatePrototypes();
  if ((bVar2) &&
     (bVar4 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)oldType), (bVar4 & 0x20) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x6d5,
                                "(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  TVar7 = RecyclableObject::GetTypeId(&pDStack_18->super_RecyclableObject);
  if (TVar7 == TypeIds_GlobalObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x6d9,"(instance->GetTypeId() != TypeIds_GlobalObject)",
                                "instance->GetTypeId() != TypeIds_GlobalObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pDVar15 = DynamicObject::GetDynamicType(pDStack_18);
  bVar2 = DynamicType::GetIsLocked(pDVar15);
  local_fa = 1;
  if (bVar2) {
    bVar4 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)oldType);
    local_fb = 1;
    if ((bVar4 & 0x20) == 0) {
      bVar2 = DynamicTypeHandler::GetIsOrMayBecomeShared((DynamicTypeHandler *)oldType);
      local_fc = 0;
      if (bVar2) {
        bVar2 = DynamicTypeHandler::IsolatePrototypes();
        local_fc = bVar2 ^ 0xff;
      }
      local_fb = local_fc;
    }
    local_fa = local_fb;
  }
  iVar8 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
  lVar16 = CONCAT44(extraout_var,iVar8);
  for (typePath._6_2_ = 0; uVar6 = GetPathLength((PathTypeHandlerBase *)oldType),
      typePath._6_2_ < uVar6; typePath._6_2_ = typePath._6_2_ + 1) {
    bVar2 = FixPropsOnPathTypes();
    pSVar12 = local_48;
    if (bVar2) {
      pTVar17 = GetTypePath((PathTypeHandlerBase *)oldType);
      pSVar12 = local_48;
      pPVar18 = TypePath::GetPropertyId(pTVar17,(uint)typePath._6_2_);
      if (lVar16 == 0) {
        PVar5 = '\a';
      }
      else {
        PVar5 = ObjectSlotAttributesToPropertyAttributes
                          (*(ObjectSlotAttributes *)(lVar16 + (ulong)typePath._6_2_));
      }
      bVar4 = TypePath::GetMaxInitializedLength(pTVar17);
      local_115 = false;
      if (local_f9 != false) {
        uVar6 = GetPathLength(this);
        local_115 = TypePath::GetIsFixedFieldAt(pTVar17,typePath._6_2_,(uint)uVar6);
      }
      local_129 = false;
      if ((local_fa & 1) != 0) {
        uVar6 = GetPathLength(this);
        local_129 = TypePath::GetIsUsedFixedFieldAt(pTVar17,typePath._6_2_,(uint)uVar6);
      }
      SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
      Add<Js::PropertyRecord_const*>
                ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *)
                 pSVar12,pPVar18,PVar5,typePath._6_2_ < bVar4,local_115,local_129,
                 (ScriptContext *)recycler);
    }
    else {
      pTVar17 = GetTypePath((PathTypeHandlerBase *)oldType);
      pPVar18 = TypePath::GetPropertyId(pTVar17,(uint)typePath._6_2_);
      if (lVar16 == 0) {
        PVar5 = '\a';
      }
      else {
        PVar5 = ObjectSlotAttributesToPropertyAttributes
                          (*(ObjectSlotAttributes *)(lVar16 + (ulong)typePath._6_2_));
      }
      SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
      Add<Js::PropertyRecord_const*>
                ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *)
                 pSVar12,pPVar18,PVar5,true,false,false,(ScriptContext *)recycler);
    }
  }
  bVar2 = FixPropsOnPathTypes();
  if (bVar2) {
    bVar2 = HasSingletonInstanceOnlyIfNeeded((PathTypeHandlerBase *)oldType);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x6ff,"(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                  "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pTVar17 = GetTypePath((PathTypeHandlerBase *)oldType);
    TypePath::ClearSingletonInstanceIfSame(pTVar17,pDStack_18);
  }
  if ((scriptContext._3_1_ & 1) != 0) {
    DynamicTypeHandler::SetFlags(&local_48->super_DynamicTypeHandler,'\f');
  }
  bVar2 = DynamicTypeHandler::IsolatePrototypes();
  if (((bVar2) &&
      (bVar2 = DynamicTypeHandler::GetIsOrMayBecomeShared((DynamicTypeHandler *)oldType), bVar2)) &&
     (bVar4 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)oldType), (bVar4 & 0x20) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x709,
                                "(!DynamicTypeHandler::IsolatePrototypes() || !oldTypeHandler->GetIsOrMayBecomeShared() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!DynamicTypeHandler::IsolatePrototypes() || !oldTypeHandler->GetIsOrMayBecomeShared() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  bVar4 = DynamicTypeHandler::GetFlags(&local_48->super_DynamicTypeHandler);
  if ((bVar4 & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x70a,"((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "Why did we create a brand new type handler with a prototype flag set?"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pSVar12 = local_48;
  values = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)oldType);
  DynamicTypeHandler::SetFlags(&pSVar12->super_DynamicTypeHandler,' ',values);
  bVar2 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&local_48->super_DynamicTypeHandler);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x70f,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pSVar12 = local_48;
  values_00 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)oldType);
  DynamicTypeHandler::SetPropertyTypes(&pSVar12->super_DynamicTypeHandler,0xb0,values_00);
  DynamicTypeHandler::SetInstanceTypeHandler(&local_48->super_DynamicTypeHandler,pDStack_18,true);
  bVar2 = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
          HasSingletonInstance(local_48);
  if ((bVar2) && (bVar2 = DynamicObject::HasSharedType(pDStack_18), bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x714,
                                "(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType())"
                                ,
                                "!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if (((local_fa & 1) == 0) &&
     ((pSVar12 = (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                  *)RecyclableObject::GetType(&pDStack_18->super_RecyclableObject),
      pSVar12 == newTypeHandler ||
      (TVar7 = Js::Type::GetTypeId((Type *)newTypeHandler), TVar7 == TypeIds_GlobalObject)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x716,
                                "(transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject))"
                                ,
                                "transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  pDVar14 = pDStack_18;
  pDVar15 = oldType;
  oldType_00 = newTypeHandler;
  pSVar12 = local_48;
  newType = DynamicObject::GetDynamicType(pDStack_18);
  TraceFixedFieldsAfterTypeHandlerChange
            (pDVar14,(DynamicTypeHandler *)pDVar15,&pSVar12->super_DynamicTypeHandler,
             (DynamicType *)oldType_00,newType,oldSingletonInstanceBefore);
  *(int *)&(recycler->parallelMarkPagePool1).pageAllocator.field_0xfc =
       *(int *)&(recycler->parallelMarkPagePool1).pageAllocator.field_0xfc + 1;
  return local_48;
}

Assistant:

T* PathTypeHandlerBase::ConvertToSimpleDictionaryType(DynamicObject* instance, int propertyCapacity, bool mayBecomeShared)
    {
        Assert(CanConvertToSimpleDictionaryType());
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        instance->PrepareForConversionToNonPathType();

        // Ideally 'this' and oldTypeHandler->GetTypeHandler() should be same
        // But we can have calls from external DOM objects, which requests us to replace the type of the
        // object with a new type. And in such cases, this API gets called with oldTypeHandler and the
        // new type (obtained from the External DOM object)
        // We use the duplicated typeHandler, if we deOptimized the object successfully, else we retain the earlier
        // behavior of using 'this' pointer.

        PathTypeHandlerBase * oldTypeHandler = nullptr;

        if (instance->DeoptimizeObjectHeaderInlining())
        {
            Assert(instance->GetTypeHandler()->IsPathTypeHandler());
            oldTypeHandler = reinterpret_cast<PathTypeHandlerBase *>(instance->GetTypeHandler());
        }
        else
        {
            oldTypeHandler = this;
        }

        Assert(oldTypeHandler);

#if ENABLE_FIXED_FIELDS
        DynamicType* oldType = instance->GetDynamicType();
#endif
        T* newTypeHandler = RecyclerNew(recycler, T, recycler, oldTypeHandler->GetSlotCapacity(), propertyCapacity, oldTypeHandler->GetInlineSlotCapacity(), oldTypeHandler->GetOffsetOfInlineSlots());
        // We expect the new type handler to start off marked as having only writable data properties.
        Assert(newTypeHandler->GetHasOnlyWritableDataProperties());

        // Care must be taken to correctly set up fixed field bits whenever a type's handler is changed.  Exactly what needs to
        // be done depends on whether the current handler is shared, whether the new handler is shared, whether the current
        // handler has the prototype flag set, and even whether we take a type transition as part of the process.
        //
        // 1. Can we set fixed bits on new handler for the fields that are marked as fixed on current handler?
        //
        //    Yes, if the new type handler is not shared.  If the handler is not shared, we know that only this instance will
        //    ever use it.  Otherwise, a different instance could transition to the same type handler, but have different values
        //    for fields marked as fixed.
        //
        // 2. Can we set fixed bits on new handler even for the fields that are not marked as fixed on current handler?
        //
        //    Yes, if the new type handler is not shared and we take a type transition during conversion.  The first condition
        //    is required for the same reason as in point 1 above.  The type transition is needed to ensure that any store
        //    field fast paths for this instance get invalidated.  If they didn't, then the newly fixed field could get
        //    overwritten on the fast path without triggering necessary invalidation.
        //
        //    Note that it's desirable to mark additional fields as fixed (particularly when the instance becomes a prototype)
        //    to counteract the effect of false type sharing, which may unnecessarily turn off some fixed field bits.
        //
        // 3. Do we need to clear any fixed field bits on the old or new type handler?
        //
        //    Yes, we must clear fixed fields bits for properties that aren't also used as fixed, but only if both type handlers
        //    are shared and we don't isolate prototypes.  This is rather tricky and results from us pre-creating certain handlers
        //    even before any instances actually have values for all represented properties.  We must avoid the situation, in which
        //    one instance switched to a new type handler with some fixed field not yet used as fixed, and later the second
        //    instance follows the same handler evolution with the same field used as fixed.  Upon switching to the new handler
        //    the second instance would "forget" that the field was used as fixed and fail to invalidate when overwritten.
        //
        //    Example: Instance A with TH1 has a fixed method FOO, which has not been used as fixed yet.  Then instance B gets
        //    pre-created and lands on TH1 (and so far assumes FOO is fixed).  As B's pre-creation continues, it moves to TH2, but
        //    thus far FOO has not been used as fixed.  Now instance A becomes a prototype, and its method FOO is used in a hard-coded
        //    JIT sequence, thus marking it as used as fixed.  Instance A then transitions to TH2 and we lose track of FOO being used
        //    as fixed.  If FOO is then overwritten on A, the hard-coded JIT sequence does not get invalidated and continues to call
        //    the old method FOO.
        //
        // 4. Can we avoid setting used as fixed bits on new handler for fields marked as used as fixed on current handler?
        //
        //    Yes, if the current type handler doesn't have the prototype flag and current handler is not shared or new handler
        //    is not shared or we isolate prototypes, and we take a type transition as part of the conversion.
        //
        //    Type transition ensures that any field loads from the instance are invalidated (including
        //    any that may have hard-coded the fixed field's value).  Hence, if the fixed field on this instance were to be later
        //    overwritten it will not cause any functional issues.  On the other hand, field loads from prototype are not affected
        //    by the prototype object's type change.  Therefore, if this instance is a prototype we must carry the used as fixed
        //    bits forward to ensure that if we overwrite any fixed field we explicitly trigger invalidation.
        //
        //    Review: Actually, the comment below is overly conservative.  If the second instance that became a prototype
        //    followed the same type evolution path, it would have to have invalidated all fixed fields, so there should be no need
        //    to transfer used as fixed bits, unless the current instance is already a prototype.
        //    In addition, if current handler is shared and the new handler is shared, a different instance with the current handler
        //    may later become a prototype (if we don't isolate prototypes) and follow the same conversion to the new handler, even
        //    if the current instance is not a prototype.  Hence, the new type handler must retain the used as fixed bits, so that
        //    proper invalidation can be triggered later, if overwritten.
        //
        //    Note that this may lead to the new type handler with some fields not marked as fixed, but marked as used as fixed.
        //
        //    Note also that if we isolate prototypes, we guarantee that no prototype instance will share a type handler with any
        //    other instance.  Hence, the problem sequence above could not take place.
        //
        // 5. Do we need to invalidate JIT-ed code for any fields marked as used as fixed on current handler?
        //
        //    No.  With the rules above any necessary invalidation will be triggered when the value actually gets overwritten.
        //

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = oldTypeHandler->GetSingletonInstance();
        oldTypeHandler->TraceFixedFieldsBeforeTypeHandlerChange(_u("converting"), _u("PathTypeHandler"), _u("SimpleDictionaryTypeHandler"), instance, oldTypeHandler, oldType, oldSingletonInstance);
#endif

        bool const canBeSingletonInstance = DynamicTypeHandler::CanBeSingletonInstance(instance);
        // If this type had been installed on a stack instance it shouldn't have a singleton Instance
        Assert(canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance());

        // Consider: It looks like we're delaying sharing of these type handlers until the second instance arrives, so we could
        // set the singleton here and zap it later.
        if (!mayBecomeShared && canBeSingletonInstance)
        {
            Assert(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded());
            if (DynamicTypeHandler::AreSingletonInstancesNeeded())
            {
                RecyclerWeakReference<DynamicObject>* curSingletonInstance = oldTypeHandler->GetTypePath()->GetSingletonInstance();
                if (curSingletonInstance != nullptr && curSingletonInstance->Get() == instance)
                {
                    newTypeHandler->SetSingletonInstance(curSingletonInstance);
                }
                else
                {
                    newTypeHandler->SetSingletonInstance(instance->CreateWeakReferenceToSelf());
                }
            }
        }

        // It would be nice to transfer fixed fields if the new type handler may become fixed later (but isn't yet).  This would allow
        // singleton instances to retain fixed fields.  It would require that when we do actually share the target type (when the second
        // instance arrives), we clear (and invalidate, if necessary) any fixed fields.  This may be a reasonable trade-off.
        bool transferIsFixed = !mayBecomeShared && canBeSingletonInstance;

        // If we are a prototype or may become a prototype we must transfer used as fixed bits.  See point 4 above.
        Assert(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0));
        // For the global object we don't emit a type check before a hard-coded use of a fixed field.  Therefore a type transition isn't sufficient to
        // invalidate any used fixed fields, and we must continue tracking them on the new type handler.  The global object should never have a path
        // type handler.
        Assert(instance->GetTypeId() != TypeIds_GlobalObject);
        // If the type isn't locked, we may not change the type of the instance, and we must also track the used fixed fields on the new handler.
        bool transferUsedAsFixed = !instance->GetDynamicType()->GetIsLocked() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) != 0 || (oldTypeHandler->GetIsOrMayBecomeShared() && !DynamicTypeHandler::IsolatePrototypes()));
#endif

        // Consider: As noted in point 2 above, when converting to non-shared SimpleDictionaryTypeHandler we could be more aggressive
        // and mark every field as fixed, because we will always take a type transition.  We have to remember to respect the switches as
        // to which kinds of properties we should fix, and for that we need the values from the instance.  Even if the type handler
        // says the property is initialized, the current instance may not have a value for it.  Check for value != null.

        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        for (PropertyIndex i = 0; i < oldTypeHandler->GetPathLength(); i++)
        {
#if ENABLE_FIXED_FIELDS
            if (PathTypeHandlerBase::FixPropsOnPathTypes())
            {
                Js::TypePath * typePath = oldTypeHandler->GetTypePath();
                newTypeHandler->Add(typePath->GetPropertyId(i), attributes ? ObjectSlotAttributesToPropertyAttributes(attributes[i]) : PropertyDynamicTypeDefaults,
                    i < typePath->GetMaxInitializedLength(),
                    transferIsFixed && typePath->GetIsFixedFieldAt(i, GetPathLength()),
                    transferUsedAsFixed && typePath->GetIsUsedFixedFieldAt(i, GetPathLength()),
                    scriptContext);
            }
            else
#endif
            {
                newTypeHandler->Add(oldTypeHandler->GetTypePath()->GetPropertyId(i), attributes ? ObjectSlotAttributesToPropertyAttributes(attributes[i]) : PropertyDynamicTypeDefaults, true, false, false, scriptContext);
            }

            // No need to clear fixed fields not used as fixed, because we never convert during pre-creation of type handlers and we always
            // add properties in order they appear on the type path.  Hence, any existing fixed fields will be turned off by any other
            // instance following this type path.  See point 3 above.
        }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        // Clear the singleton from this handler regardless of mayBecomeShared, because this instance no longer uses this handler.
        if (PathTypeHandlerBase::FixPropsOnPathTypes())
        {
            Assert(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded());
            oldTypeHandler->GetTypePath()->ClearSingletonInstanceIfSame(instance);
        }
#endif

        if (mayBecomeShared)
        {
            newTypeHandler->SetFlags(IsLockedFlag | MayBecomeSharedFlag);
        }

        Assert(!DynamicTypeHandler::IsolatePrototypes() || !oldTypeHandler->GetIsOrMayBecomeShared() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0));
        AssertMsg((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0, "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, oldTypeHandler->GetFlags());

        // Any new type handler we expect to see here should have inline slot capacity locked.  If this were to change, we would need
        // to update our shrinking logic (see ShrinkSlotAndInlineSlotCapacity).
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, oldTypeHandler->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

#if ENABLE_FIXED_FIELDS
        Assert(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType());
        // We assumed that we don't need to transfer used as fixed bits unless we are a prototype, which is only valid if we also changed the type.
        Assert(transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject));

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        PathTypeHandlerBase::TraceFixedFieldsAfterTypeHandlerChange(instance, oldTypeHandler, newTypeHandler, oldType, instance->GetDynamicType(), oldSingletonInstance);
#endif
#endif

#ifdef PROFILE_TYPES
        scriptContext->convertPathToSimpleDictionaryCount++;
#endif
        return newTypeHandler;
    }